

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O1

bool ON_SHA1::Validate(void)

{
  bool bVar1;
  ON__UINT32 OVar2;
  ON__UINT64 sizeof_buffer;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ON_SHA1_Hash sha1_digestx;
  ON_SHA1_Hash sha1_digest;
  ON__UINT8 a [200];
  ON_RandomNumberGenerator rng;
  undefined1 local_b78 [16];
  undefined1 local_b68 [16];
  undefined1 local_b58 [16];
  undefined1 local_b48 [16];
  undefined1 local_b38 [16];
  ON__UINT32 aOStack_b28 [2];
  ON__UINT32 OStack_b20;
  ON__UINT32 local_b1c;
  ON__UINT32 aOStack_b18 [3];
  ON_SHA1_Hash local_b0c;
  ON_SHA1_Hash local_af0;
  ON_SHA1_Hash local_adc;
  undefined1 local_ac8 [212];
  ON_RandomNumberGenerator local_9f4;
  
  bVar1 = SHA1_ValidateHelper("",&DAT_006dafc0);
  if ((((bVar1) &&
       (auVar7[0] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0x10] == 0xaf),
       auVar7[1] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0x11] == 0xd8),
       auVar7[2] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0x12] == '\a'),
       auVar7[3] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0x13] == '\t'), auVar7[4] = 0xff,
       auVar7[5] = 0xff, auVar7[6] = 0xff, auVar7[7] = 0xff, auVar7[8] = 0xff, auVar7[9] = 0xff,
       auVar7[10] = 0xff, auVar7[0xb] = 0xff, auVar7[0xc] = 0xff, auVar7[0xd] = 0xff,
       auVar7[0xe] = 0xff, auVar7[0xf] = 0xff,
       auVar4[0] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0] == 0xda),
       auVar4[1] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[1] == '9'),
       auVar4[2] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[2] == 0xa3),
       auVar4[3] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[3] == 0xee),
       auVar4[4] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[4] == '^'),
       auVar4[5] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[5] == 'k'),
       auVar4[6] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[6] == 'K'),
       auVar4[7] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[7] == '\r'),
       auVar4[8] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[8] == '2'),
       auVar4[9] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[9] == 'U'),
       auVar4[10] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[10] == 0xbf),
       auVar4[0xb] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0xb] == 0xef),
       auVar4[0xc] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0xc] == 0x95),
       auVar4[0xd] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0xd] == '`'),
       auVar4[0xe] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0xe] == '\x18'),
       auVar4[0xf] = -(ON_SHA1_Hash::EmptyContentHash.m_digest[0xf] == 0x90),
       auVar4 = auVar4 & auVar7,
       (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
               (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff)) &&
      (bVar1 = SHA1_ValidateHelper("abc",&DAT_006dafe0), bVar1)) &&
     (((bVar1 = SHA1_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",
                                    &DAT_006db000), bVar1 &&
       (bVar1 = SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog",&DAT_006db020),
       bVar1)) &&
      ((bVar1 = SHA1_ValidateHelper("The quick brown fox jumps over the lazy cog",&DAT_006db040),
       bVar1 && (bVar1 = SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog.",
                                             &DAT_006db060), bVar1)))))) {
    memset(local_ac8,0x61,200);
    aOStack_b18[0] = 0;
    aOStack_b18[1] = 0;
    aOStack_b18[2] = 0;
    aOStack_b28[0] = 0;
    aOStack_b28[1] = 0;
    OStack_b20 = 0;
    local_b1c = 0;
    local_b38 = (undefined1  [16])0x0;
    local_b48 = (undefined1  [16])0x0;
    local_b58 = (undefined1  [16])0x0;
    local_b68 = (undefined1  [16])0x0;
    local_b78 = (undefined1  [16])0x0;
    ON_SHA1_Hash::ON_SHA1_Hash(&local_b0c);
    uVar3 = 0;
    do {
      if (999999 < uVar3) {
        Hash(&local_adc,(ON_SHA1 *)local_b78);
        auVar8[0] = -(local_adc.m_digest[0x10] == 'e');
        auVar8[1] = -(local_adc.m_digest[0x11] == '4');
        auVar8[2] = -(local_adc.m_digest[0x12] == '\x01');
        auVar8[3] = -(local_adc.m_digest[0x13] == 'o');
        auVar8[4] = 0xff;
        auVar8[5] = 0xff;
        auVar8[6] = 0xff;
        auVar8[7] = 0xff;
        auVar8[8] = 0xff;
        auVar8[9] = 0xff;
        auVar8[10] = 0xff;
        auVar8[0xb] = 0xff;
        auVar8[0xc] = 0xff;
        auVar8[0xd] = 0xff;
        auVar8[0xe] = 0xff;
        auVar8[0xf] = 0xff;
        auVar5[0] = -(local_adc.m_digest[0] == '4');
        auVar5[1] = -(local_adc.m_digest[1] == 0xaa);
        auVar5[2] = -(local_adc.m_digest[2] == 0x97);
        auVar5[3] = -(local_adc.m_digest[3] == '<');
        auVar5[4] = -(local_adc.m_digest[4] == 0xd4);
        auVar5[5] = -(local_adc.m_digest[5] == 0xc4);
        auVar5[6] = -(local_adc.m_digest[6] == 0xda);
        auVar5[7] = -(local_adc.m_digest[7] == 0xa4);
        auVar5[8] = -(local_adc.m_digest[8] == 0xf6);
        auVar5[9] = -(local_adc.m_digest[9] == '\x1e');
        auVar5[10] = -(local_adc.m_digest[10] == 0xeb);
        auVar5[0xb] = -(local_adc.m_digest[0xb] == '+');
        auVar5[0xc] = -(local_adc.m_digest[0xc] == 0xdb);
        auVar5[0xd] = -(local_adc.m_digest[0xd] == 0xad);
        auVar5[0xe] = -(local_adc.m_digest[0xe] == '\'');
        auVar5[0xf] = -(local_adc.m_digest[0xf] == '1');
        auVar5 = auVar5 & auVar8;
        if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) != 0xffff) {
          return false;
        }
        aOStack_b28[0] = 0;
        aOStack_b28[1] = 0;
        OStack_b20 = 0x67452301;
        local_b1c = 0xefcdab89;
        aOStack_b18[0] = 0x98badcfe;
        aOStack_b18[1] = 0x10325476;
        aOStack_b18[2] = 0xc3d2e1f0;
        local_b78._0_12_ = ZEXT412(1) << 0x40;
        ON_RandomNumberGenerator::ON_RandomNumberGenerator(&local_9f4);
        uVar3 = 0;
        do {
          if (999999 < uVar3) {
            Hash(&local_af0,(ON_SHA1 *)local_b78);
            auVar9[0] = -(local_af0.m_digest[0] == '4');
            auVar9[1] = -(local_af0.m_digest[1] == 0xaa);
            auVar9[2] = -(local_af0.m_digest[2] == 0x97);
            auVar9[3] = -(local_af0.m_digest[3] == '<');
            auVar9[4] = -(local_af0.m_digest[4] == 0xd4);
            auVar9[5] = -(local_af0.m_digest[5] == 0xc4);
            auVar9[6] = -(local_af0.m_digest[6] == 0xda);
            auVar9[7] = -(local_af0.m_digest[7] == 0xa4);
            auVar9[8] = -(local_af0.m_digest[8] == 0xf6);
            auVar9[9] = -(local_af0.m_digest[9] == '\x1e');
            auVar9[10] = -(local_af0.m_digest[10] == 0xeb);
            auVar9[0xb] = -(local_af0.m_digest[0xb] == '+');
            auVar9[0xc] = -(local_af0.m_digest[0xc] == 0xdb);
            auVar9[0xd] = -(local_af0.m_digest[0xd] == 0xad);
            auVar9[0xe] = -(local_af0.m_digest[0xe] == '\'');
            auVar9[0xf] = -(local_af0.m_digest[0xf] == '1');
            auVar6[0] = -(local_af0.m_digest[0x10] == 'e');
            auVar6[1] = -(local_af0.m_digest[0x11] == '4');
            auVar6[2] = -(local_af0.m_digest[0x12] == '\x01');
            auVar6[3] = -(local_af0.m_digest[0x13] == 'o');
            auVar6[4] = 0xff;
            auVar6[5] = 0xff;
            auVar6[6] = 0xff;
            auVar6[7] = 0xff;
            auVar6[8] = 0xff;
            auVar6[9] = 0xff;
            auVar6[10] = 0xff;
            auVar6[0xb] = 0xff;
            auVar6[0xc] = 0xff;
            auVar6[0xd] = 0xff;
            auVar6[0xe] = 0xff;
            auVar6[0xf] = 0xff;
            auVar6 = auVar6 & auVar9;
            return (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff;
          }
          OVar2 = ON_RandomNumberGenerator::RandomNumber(&local_9f4);
          sizeof_buffer = 1000000 - uVar3;
          if (OVar2 % 100 + uVar3 + 100 < 0xf4241) {
            sizeof_buffer = (ulong)(OVar2 % 100) + 100;
          }
          AccumulateBytes((ON_SHA1 *)local_b78,local_ac8,sizeof_buffer);
          uVar3 = uVar3 + sizeof_buffer;
        } while (local_b78._0_8_ == uVar3);
        return false;
      }
      AccumulateBytes((ON_SHA1 *)local_b78,local_ac8,200);
      uVar3 = uVar3 + 200;
    } while (uVar3 == local_b78._0_8_);
  }
  return false;
}

Assistant:

bool ON_SHA1::Validate()
{
  // "" (empty string)
  // da39a3ee 5e6b4b0d 3255bfef 95601890 afd80709
  const ON__UINT8 empty_string[20] = {
    0xda, 0x39, 0xa3, 0xee,
    0x5e, 0x6b, 0x4b, 0x0d,
    0x32, 0x55, 0xbf, 0xef,
    0x95, 0x60, 0x18, 0x90,
    0xaf, 0xd8, 0x07, 0x09 
  };
  if (false == SHA1_ValidateHelper("",empty_string))
    return false;

  
  if (0 != memcmp(&ON_SHA1_Hash::EmptyContentHash ,empty_string, sizeof(empty_string)))
    return false;

  // "abc"
  // a9993e36 4706816a ba3e2571 7850c26c 9cd0d89d
  const ON__UINT8 abc[20]  = { 
    0xa9, 0x99, 0x3e, 0x36,
    0x47, 0x06, 0x81, 0x6a,
    0xba, 0x3e, 0x25, 0x71,
    0x78, 0x50, 0xc2, 0x6c,
    0x9c, 0xd0, 0xd8, 0x9d  
  };
  if (false == SHA1_ValidateHelper("abc",abc))
    return false;

  // "abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq"
  // 84983e44 1c3bd26e baae4aa1 f95129e5 e54670f1
  const ON__UINT8 abc_x[20] = { 
    0x84, 0x98, 0x3e, 0x44,
    0x1c, 0x3b, 0xd2, 0x6e,
    0xba, 0xae, 0x4a, 0xa1,
    0xf9, 0x51, 0x29, 0xe5,
    0xe5, 0x46, 0x70, 0xf1 
  };
  if (false == SHA1_ValidateHelper("abcdbcdecdefdefgefghfghighijhijkijkljklmklmnlmnomnopnopq",abc_x))
    return false;

  // "The quick brown fox jumps over the lazy dog"
  // 2fd4e1c6 7a2d28fc ed849ee1 bb76e739 1b93eb12
  const ON__UINT8 quickfox[20] = {
    0x2f, 0xd4, 0xe1, 0xc6,
    0x7a, 0x2d, 0x28, 0xfc,
    0xed, 0x84, 0x9e, 0xe1,
    0xbb, 0x76, 0xe7, 0x39,
    0x1b, 0x93, 0xeb, 0x12 
  };
  if (false == SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog",quickfox))
    return false;

  // "The quick brown fox jumps over the lazy cog"
  // de9f2c7f d25e1b3a fad3e85a 0bd17d9b 100db4b3
  const ON__UINT8 lazycog[20] = {
    0xde, 0x9f, 0x2c, 0x7f,
    0xd2, 0x5e, 0x1b, 0x3a,
    0xfa, 0xd3, 0xe8, 0x5a,
    0x0b, 0xd1, 0x7d, 0x9b,
    0x10, 0x0d, 0xb4, 0xb3 
  };
  if (false == SHA1_ValidateHelper("The quick brown fox jumps over the lazy cog",lazycog))
    return false;

  // "The quick brown fox jumps over the lazy dog."
  // 408d9438 4216f890 ff7a0c35 28e8bed1 e0b01621
  const ON__UINT8 quickfoxperiod[20] = {
    0x40, 0x8d, 0x94, 0x38,
    0x42, 0x16, 0xf8, 0x90,
    0xff, 0x7a, 0x0c, 0x35,
    0x28, 0xe8, 0xbe, 0xd1,
    0xe0, 0xb0, 0x16, 0x21 
  };
  if (false == SHA1_ValidateHelper("The quick brown fox jumps over the lazy dog.",quickfoxperiod))
    return false;

  // 1,000,000 repetitions of the character "a".
  // 34AA973C D4C4DAA4 F61EEB2B DBAD2731 6534016F
  const ON__UINT8 millionXa[20] = {
    0x34, 0xAA, 0x97, 0x3C,
    0xD4, 0xC4, 0xDA, 0xA4,
    0xF6, 0x1E, 0xEB, 0x2B,
    0xDB, 0xAD, 0x27, 0x31,
    0x65, 0x34, 0x01, 0x6F 
  };

  const size_t one_million = 1000000;
  ON__UINT8 a[200];
  const size_t a_count = sizeof(a) / sizeof(a[0]);
  for ( size_t i = 0; i < a_count; i++)
    a[i] = 'a';  
  ON_SHA1 sha1;
  size_t total_count = 0;
  for (total_count = 0; total_count < one_million; total_count += a_count)
  {
    sha1.AccumulateBytes(a, a_count);
    if (sha1.ByteCount() != (ON__UINT64)(total_count+a_count))
      return false;
  }
  
  ON_SHA1_Hash sha1_digest(sha1.Hash());

  if (0 != memcmp(&sha1_digest,millionXa,sizeof(millionXa)))
    return false;

  sha1.Reset();
  ON_RandomNumberGenerator rng;
  total_count = 0; 
  const size_t min_count = (a_count >= 10000) ? a_count/1000 : 100;
  while (total_count < one_million)
  {
    size_t count = min_count + (rng.RandomNumber() % (ON__UINT32)min_count);
    if ( total_count + count > one_million )
      count = one_million - total_count;
    sha1.AccumulateBytes(a, count);
    total_count += count;
    if (sha1.ByteCount() != (ON__UINT64)total_count)
      return false;
  }

  
  ON_SHA1_Hash sha1_digestx(sha1.Hash());

  if (0 != memcmp(&sha1_digestx,millionXa,sizeof(millionXa)))
    return false;

  return true;
}